

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

void Gem_ManRealloc(Gem_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  Gem_Obj_t *pGVar3;
  size_t __size;
  char *__assertion;
  int iVar4;
  
  uVar1 = p->nObjsAlloc;
  if (p->nObjs == uVar1) {
    if (uVar1 == 0x7fffffff) {
      puts("Hard limit on the number of nodes (0x7FFFFFFF) is reached. Quitting...");
      exit(1);
    }
    uVar2 = (long)(int)uVar1 * 2;
    iVar4 = (int)uVar2;
    if ((int)uVar1 < iVar4) {
      printf("Extending object storage: %d -> %d.\n",(ulong)uVar1,uVar2 & 0xffffffff);
      __size = (long)(int)uVar1 << 4;
      if (p->pObjs == (Gem_Obj_t *)0x0) {
        pGVar3 = (Gem_Obj_t *)malloc(__size);
      }
      else {
        pGVar3 = (Gem_Obj_t *)realloc(p->pObjs,__size);
      }
      p->pObjs = pGVar3;
      memset(pGVar3 + p->nObjsAlloc,0,((long)iVar4 - (long)p->nObjsAlloc) * 8);
      p->nObjsAlloc = iVar4;
      return;
    }
    __assertion = "p->nObjs < nObjNew";
    uVar1 = 0x78;
  }
  else {
    __assertion = "p->nObjs == p->nObjsAlloc";
    uVar1 = 0x75;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                ,uVar1,"void Gem_ManRealloc(Gem_Man_t *)");
}

Assistant:

void Gem_ManRealloc( Gem_Man_t * p )
{
    int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, 0x7FFFFFFF );
    assert( p->nObjs == p->nObjsAlloc );
    if ( p->nObjs == 0x7FFFFFFF )
        printf( "Hard limit on the number of nodes (0x7FFFFFFF) is reached. Quitting...\n" ), exit(1);
    assert( p->nObjs < nObjNew );
    printf("Extending object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
    p->pObjs = ABC_REALLOC( Gem_Obj_t, p->pObjs, nObjNew );
    memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gem_Obj_t) * (nObjNew - p->nObjsAlloc) );
    p->nObjsAlloc = nObjNew;
}